

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_node.h
# Opt level: O0

void __thiscall compose::TreeNode::TreeNode(TreeNode *this,string *name)

{
  string *name_local;
  TreeNode *this_local;
  
  INode::INode(&this->super_INode);
  (this->super_INode)._vptr_INode = (_func_int **)&PTR_AddNode_0019e770;
  std::vector<std::shared_ptr<compose::INode>,_std::allocator<std::shared_ptr<compose::INode>_>_>::
  vector(&this->nodes_);
  std::__cxx11::string::operator=((string *)&(this->super_INode).name_,(string *)name);
  return;
}

Assistant:

TreeNode::TreeNode(const std::string& name) {
    name_ = name;
}